

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ProgramBinaryCase::getBinaryFormats
          (ProgramBinaryCase *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  pointer puVar1;
  undefined8 in_RAX;
  size_type __new_size;
  GLint numFormats;
  undefined8 local_18;
  
  local_18 = CONCAT44((int)((ulong)in_RAX >> 0x20),0xffffffff);
  glu::CallLogWrapper::glGetIntegerv(&this->super_CallLogWrapper,0x87fe,(GLint *)&local_18);
  puVar1 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  __new_size = (size_type)(int)local_18;
  if (0 < (long)__new_size) {
    local_18 = local_18 & 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (out,__new_size,(value_type_conflict2 *)((long)&local_18 + 4));
    glu::CallLogWrapper::glGetIntegerv
              (&this->super_CallLogWrapper,0x87ff,
               (GLint *)(out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProgramBinaryCase::getBinaryFormats (std::vector<GLenum>& out)
{
	GLint numFormats = -1;
	glGetIntegerv(GL_NUM_PROGRAM_BINARY_FORMATS, &numFormats);

	out.clear();

	if (numFormats > 0)
	{
		out.resize(numFormats, 0);

		glGetIntegerv(GL_PROGRAM_BINARY_FORMATS, (GLint*)&out[0]);
	}
}